

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O1

int Assimp_Info(char **params,uint num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  aiTextureType type;
  aiNode *paVar6;
  aiMesh *paVar7;
  uint cnt;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  aiReturn aVar13;
  aiScene *scene;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint i_1;
  bool bVar17;
  int iVar18;
  ulong uVar19;
  char *pcVar20;
  bool bVar21;
  ulong uVar22;
  bool verbose;
  ulong uVar23;
  int iVar24;
  uint idx;
  int iVar25;
  aiVector3D special_points [3];
  ImportData import;
  string in;
  aiMemoryInfo mem;
  aiString name;
  undefined1 local_4d8 [12];
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  ImportData local_4a8;
  string local_478;
  aiMemoryInfo local_458;
  undefined1 local_438 [1032];
  
  pcVar20 = *params;
  iVar8 = strcmp(pcVar20,"-h");
  if (((iVar8 == 0) || (iVar8 = strcmp(pcVar20,"--help"), iVar8 == 0)) ||
     (iVar8 = strcmp(pcVar20,"-?"), iVar8 == 0)) {
    iVar8 = 0;
    printf("%s",AICMD_MSG_INFO_HELP_E);
  }
  else if (num == 0) {
    puts("assimp info: Invalid number of arguments. See \'assimp info --help\'");
    iVar8 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,pcVar20,(allocator<char> *)local_438);
    if (num == 1) {
      bVar17 = false;
      verbose = false;
      bVar21 = false;
    }
    else {
      uVar23 = 1;
      bVar21 = false;
      verbose = false;
      bVar17 = false;
      do {
        pcVar20 = params[uVar23];
        iVar8 = strcmp(pcVar20,"--raw");
        if ((iVar8 == 0) || (iVar8 = strcmp(pcVar20,"-r"), iVar8 == 0)) {
          bVar17 = true;
        }
        iVar8 = strcmp(pcVar20,"--verbose");
        if ((iVar8 == 0) || (iVar8 = strcmp(pcVar20,"-v"), iVar8 == 0)) {
          verbose = true;
        }
        iVar8 = strcmp(pcVar20,"--silent");
        if ((iVar8 == 0) || (iVar8 = strcmp(pcVar20,"-s"), iVar8 == 0)) {
          bVar21 = true;
        }
        uVar23 = uVar23 + 1;
      } while (num != uVar23);
    }
    if ((verbose & bVar21) == 0) {
      local_4a8.logFile._M_dataplus._M_p = (pointer)&local_4a8.logFile.field_2;
      local_4a8.ppFlags = 0;
      local_4a8.showLog = false;
      local_4a8.logFile._M_string_length = 0;
      local_4a8.logFile.field_2._M_local_buf[0] = '\0';
      local_4a8.verbose = false;
      local_4a8.log = false;
      if ((!bVar17) &&
         (ProcessStandardArguments(&local_4a8,params + 1,num - 1), local_4a8.ppFlags == 0)) {
        local_4a8.ppFlags = 0x379ecb;
      }
      scene = ImportModel(&local_4a8,&local_478);
      if (scene == (aiScene *)0x0) {
        printf("assimp info: Unable to load input file %s\n",local_478._M_dataplus._M_p);
        iVar8 = 5;
      }
      else {
        local_458.animations = 0;
        local_458.cameras = 0;
        local_458.lights = 0;
        local_458.total = 0;
        local_458.textures = 0;
        local_458.materials = 0;
        local_458.meshes = 0;
        local_458.nodes = 0;
        Assimp::Importer::GetMemoryRequirements(globalImporter,&local_458);
        local_4c8 = 0;
        uStack_4c0 = 0;
        local_4d8._0_4_ = 0.0;
        local_4d8._4_4_ = 0.0;
        stack0xfffffffffffffb30 = 0;
        local_4b8 = 0.0;
        FindSpecialPoints(scene,(aiVector3D *)local_4d8);
        uVar23 = (ulong)local_458._24_8_ >> 0x20;
        paVar6 = scene->mRootNode;
        uVar9 = CountNodes(paVar6);
        uVar10 = GetMaxDepth(paVar6);
        uVar22 = (ulong)scene->mNumMeshes;
        iVar8 = 0;
        iVar18 = 0;
        if (uVar22 != 0) {
          uVar14 = 0;
          iVar18 = 0;
          do {
            iVar18 = iVar18 + scene->mMeshes[uVar14]->mNumVertices;
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
        uVar14 = (ulong)scene->mNumAnimations;
        if (uVar22 != 0) {
          uVar15 = 0;
          iVar8 = 0;
          do {
            iVar8 = iVar8 + scene->mMeshes[uVar15]->mNumFaces;
            uVar15 = uVar15 + 1;
          } while (uVar22 != uVar15);
        }
        iVar24 = 0;
        iVar25 = 0;
        if (uVar22 != 0) {
          uVar15 = 0;
          iVar25 = 0;
          do {
            iVar25 = iVar25 + scene->mMeshes[uVar15]->mNumBones;
            uVar15 = uVar15 + 1;
          } while (uVar22 != uVar15);
        }
        if (uVar14 != 0) {
          uVar15 = 0;
          iVar24 = 0;
          do {
            iVar24 = iVar24 + scene->mAnimations[uVar15]->mNumChannels;
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        uVar1 = scene->mNumMaterials;
        uVar2 = scene->mNumTextures;
        uVar3 = scene->mNumCameras;
        uVar4 = scene->mNumLights;
        FindPTypes_abi_cxx11_((string *)local_438,scene);
        uVar5 = scene->mNumMeshes;
        uVar15 = (ulong)uVar5;
        uVar12 = 0;
        uVar11 = 0;
        if (uVar15 != 0) {
          uVar19 = 0;
          uVar11 = 0;
          do {
            uVar11 = uVar11 + scene->mMeshes[uVar19]->mNumFaces;
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
          uVar11 = uVar11 / uVar5;
        }
        if (uVar15 != 0) {
          uVar19 = 0;
          uVar12 = 0;
          do {
            uVar12 = uVar12 + scene->mMeshes[uVar19]->mNumVertices;
            uVar19 = uVar19 + 1;
          } while (uVar15 != uVar19);
          uVar12 = uVar12 / uVar5;
        }
        printf("Memory consumption: %i B\nNodes:              %i\nMaximum depth       %i\nMeshes:             %i\nAnimations:         %i\nTextures (embed.):  %i\nMaterials:          %i\nCameras:            %i\nLights:             %i\nVertices:           %i\nFaces:              %i\nBones:              %i\nAnimation Channels: %i\nPrimitive Types:    %s\nAverage faces/mesh  %i\nAverage verts/mesh  %i\nMinimum point      (%f %f %f)\nMaximum point      (%f %f %f)\nCenter point       (%f %f %f)\n"
               ,SUB84((double)(float)local_4d8._0_4_,0),(double)(float)local_4d8._4_4_,
               (double)(float)local_4d8._8_4_,(double)fStack_4cc,(double)(float)local_4c8,
               (double)local_4c8._4_4_,(double)(float)uStack_4c0,(double)uStack_4c0._4_4_,uVar23,
               (ulong)uVar9,(ulong)uVar10,uVar22,uVar14,uVar2,uVar1,uVar3,uVar4,iVar18,iVar8,iVar25,
               iVar24,local_438._0_8_,uVar11,uVar12,(double)local_4b8);
        if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        if (!bVar21) {
          if (scene->mNumMeshes != 0) {
            puts("\nMeshes:  (name) [vertices / bones / faces | primitive_types]");
          }
          if (scene->mNumMeshes != 0) {
            uVar23 = 0;
            do {
              paVar7 = scene->mMeshes[uVar23];
              printf("    %d (%s)",uVar23 & 0xffffffff,(paVar7->mName).data);
              printf(": [%d / %d / %d |",(ulong)paVar7->mNumVertices,(ulong)paVar7->mNumBones,
                     (ulong)paVar7->mNumFaces);
              uVar9 = paVar7->mPrimitiveTypes;
              if ((uVar9 & 1) != 0) {
                printf(" point");
              }
              if ((uVar9 & 2) != 0) {
                printf(" line");
              }
              if ((uVar9 & 4) != 0) {
                printf(" triangle");
              }
              if ((uVar9 & 8) != 0) {
                printf(" polygon");
              }
              puts("]");
              uVar23 = uVar23 + 1;
            } while (uVar23 < scene->mNumMeshes);
          }
          if (scene->mNumMaterials != 0) {
            uVar23 = 0;
            iVar8 = 0;
            do {
              local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
              memset(local_438 + 5,0x1b,0x3ff);
              aVar13 = aiGetMaterialString(scene->mMaterials[uVar23],"?mat.name",0,0,
                                           (aiString *)local_438);
              if (aVar13 == aiReturn_SUCCESS) {
                pcVar20 = "";
                if (iVar8 == 0) {
                  pcVar20 = "\nNamed Materials:";
                }
                printf("%s\n    \'%s\'",pcVar20,local_438 + 4);
                iVar8 = iVar8 + 1;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 < scene->mNumMaterials);
            if (iVar8 != 0) {
              putchar(10);
            }
          }
          if (scene->mNumMaterials != 0) {
            uVar23 = 0;
            iVar8 = 0;
            do {
              local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
              memset(local_438 + 5,0x1b,0x3ff);
              lVar16 = 0;
              do {
                iVar18 = iVar8;
                type = Assimp_Info::types[lVar16];
                uVar9 = 0;
                while( true ) {
                  aVar13 = aiGetMaterialString(scene->mMaterials[uVar23],"$tex.file",type,uVar9,
                                               (aiString *)local_438);
                  if (aVar13 != aiReturn_SUCCESS) break;
                  pcVar20 = "";
                  if (iVar18 + uVar9 == 0) {
                    pcVar20 = "\nTexture Refs:";
                  }
                  printf("%s\n    \'%s\'",pcVar20,local_438 + 4);
                  uVar9 = uVar9 + 1;
                }
                lVar16 = lVar16 + 1;
                iVar8 = iVar18 + uVar9;
              } while (lVar16 != 0xd);
              uVar23 = uVar23 + 1;
              iVar8 = iVar18 + uVar9;
            } while (uVar23 < scene->mNumMaterials);
            if (iVar18 + uVar9 != 0) {
              putchar(10);
            }
          }
          if (scene->mNumAnimations != 0) {
            uVar23 = 0;
            iVar8 = 0;
            do {
              if ((scene->mAnimations[uVar23]->mName).length != 0) {
                pcVar20 = "";
                if (iVar8 == 0) {
                  pcVar20 = "\nNamed Animations:";
                }
                printf("%s\n     \'%s\'",pcVar20,(scene->mAnimations[uVar23]->mName).data);
                iVar8 = iVar8 + 1;
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 < scene->mNumAnimations);
            if (iVar8 != 0) {
              putchar(10);
            }
          }
          puts("\nNode hierarchy:");
          paVar6 = scene->mRootNode;
          local_438._0_8_ = local_438 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
          PrintHierarchy(paVar6,(string *)local_438,verbose,false,true);
          if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
        }
        putchar(10);
        iVar8 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8.logFile._M_dataplus._M_p != &local_4a8.logFile.field_2) {
        operator_delete(local_4a8.logFile._M_dataplus._M_p,
                        CONCAT71(local_4a8.logFile.field_2._M_allocated_capacity._1_7_,
                                 local_4a8.logFile.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
      iVar8 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar8;
}

Assistant:

int Assimp_Info (const char* const* params, unsigned int num) {
	// --help
	if (!strcmp( params[0],"-h")||!strcmp( params[0],"--help")||!strcmp( params[0],"-?") ) {
		printf("%s",AICMD_MSG_INFO_HELP_E);
		return 0;
	}

	// asssimp info <file> [-r]
	if (num < 1) {
		printf("assimp info: Invalid number of arguments. "
			"See \'assimp info --help\'\n");
		return 1;
	}

	const std::string in  = std::string(params[0]);

	// get -r and -v arguments
	bool raw = false;
	bool verbose = false;
	bool silent = false;
	for(unsigned int i = 1; i < num; ++i) {
		if (!strcmp(params[i],"--raw")||!strcmp(params[i],"-r")) {
			raw = true;
		}
		if (!strcmp(params[i],"--verbose")||!strcmp(params[i],"-v")) {
			verbose = true;
		}
		if (!strcmp(params[i], "--silent") || !strcmp(params[i], "-s")) {
			silent = true;
		}
	}

	// Verbose and silent at the same time are not allowed
	if ( verbose && silent ) {
		printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
		return 1;
	}
	
	// Parse post-processing flags unless -r was specified
	ImportData import;
	if (!raw) {
		// get import flags
		ProcessStandardArguments(import, params + 1, num - 1);

		//No custom post process flags defined, we set all the post process flags active
		if(import.ppFlags == 0)
			import.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp info: Unable to load input file %s\n",
			in.c_str());
		return 5;
	}

	aiMemoryInfo mem;
	globalImporter->GetMemoryRequirements(mem);


	static const char* format_string =
		"Memory consumption: %i B\n"
		"Nodes:              %i\n"
		"Maximum depth       %i\n"
		"Meshes:             %i\n"
		"Animations:         %i\n"
		"Textures (embed.):  %i\n"
		"Materials:          %i\n"
		"Cameras:            %i\n"
		"Lights:             %i\n"
		"Vertices:           %i\n"
		"Faces:              %i\n"
		"Bones:              %i\n"
		"Animation Channels: %i\n"
		"Primitive Types:    %s\n"
		"Average faces/mesh  %i\n"
		"Average verts/mesh  %i\n"
		"Minimum point      (%f %f %f)\n"
		"Maximum point      (%f %f %f)\n"
		"Center point       (%f %f %f)\n"

		;

	aiVector3D special_points[3];
	FindSpecialPoints(scene,special_points);
	printf(format_string,
		mem.total,
		CountNodes(scene->mRootNode),
		GetMaxDepth(scene->mRootNode),
		scene->mNumMeshes,
		scene->mNumAnimations,
		scene->mNumTextures,
		scene->mNumMaterials,
		scene->mNumCameras,
		scene->mNumLights,
		CountVertices(scene),
		CountFaces(scene),
		CountBones(scene),
		CountAnimChannels(scene),
		FindPTypes(scene).c_str(),
		GetAvgFacePerMesh(scene),
		GetAvgVertsPerMesh(scene),
		special_points[0][0],special_points[0][1],special_points[0][2],
		special_points[1][0],special_points[1][1],special_points[1][2],
		special_points[2][0],special_points[2][1],special_points[2][2]
		)
	;

	if (silent)
	{
		printf("\n");
		return 0;
	}

	// meshes
	if (scene->mNumMeshes) {
		printf("\nMeshes:  (name) [vertices / bones / faces | primitive_types]\n");
	}
	for (unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		printf("    %d (%s)", i, mesh->mName.C_Str());
		printf(
			": [%d / %d / %d |",
			mesh->mNumVertices,
			mesh->mNumBones,
			mesh->mNumFaces
		);
		const unsigned int ptypes = mesh->mPrimitiveTypes;
		if (ptypes & aiPrimitiveType_POINT) { printf(" point"); }
		if (ptypes & aiPrimitiveType_LINE) { printf(" line"); }
		if (ptypes & aiPrimitiveType_TRIANGLE) { printf(" triangle"); }
		if (ptypes & aiPrimitiveType_POLYGON) { printf(" polygon"); }
		printf("]\n");
	}

	// materials
	unsigned int total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		if (AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],AI_MATKEY_NAME,&name)) {
			printf("%s\n    \'%s\'",(total++?"":"\nNamed Materials:" ),name.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// textures
	total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		static const aiTextureType types[] = {
			aiTextureType_NONE,
			aiTextureType_DIFFUSE,
			aiTextureType_SPECULAR,
			aiTextureType_AMBIENT,
			aiTextureType_EMISSIVE,
			aiTextureType_HEIGHT,
			aiTextureType_NORMALS,
			aiTextureType_SHININESS,
			aiTextureType_OPACITY,
			aiTextureType_DISPLACEMENT,
			aiTextureType_LIGHTMAP,
			aiTextureType_REFLECTION,
			aiTextureType_UNKNOWN
		};
		for(unsigned int type = 0; type < sizeof(types)/sizeof(types[0]); ++type) {
			for(unsigned int idx = 0;AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],
				AI_MATKEY_TEXTURE(types[type],idx),&name); ++idx) {
				printf("%s\n    \'%s\'",(total++?"":"\nTexture Refs:" ),name.data);
			}
		}
	}
	if(total) {
		printf("\n");
	}

	// animations
	total=0;
	for(unsigned int i = 0;i < scene->mNumAnimations; ++i) {
		if (scene->mAnimations[i]->mName.length) {
			printf("%s\n     \'%s\'",(total++?"":"\nNamed Animations:" ),scene->mAnimations[i]->mName.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// node hierarchy
	printf("\nNode hierarchy:\n");
	PrintHierarchy(scene->mRootNode,"",verbose);

	printf("\n");
	return 0;
}